

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::pair<int,_int>_>::setData(Parameter<std::pair<int,_int>_> *this,string *sval)

{
  bool bVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  Parameter<std::pair<int,_int>_> *in_stack_00000010;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  bVar1 = Parameter<std::pair<int,int>>::internalSetData<std::__cxx11::string>
                    (in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

virtual bool setData(std::string sval) {
    return internalSetData<std::string>(sval);
  }